

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_logger.cpp
# Opt level: O0

void __thiscall
ot::commissioner::SysLogger::Log(SysLogger *this,LogLevel aLevel,string *aRegion,string *aMsg)

{
  int __pri;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  LogLevel aLevel_00;
  undefined8 in_R9;
  string *__return_storage_ptr__;
  string local_48;
  string *local_28;
  string *aMsg_local;
  string *aRegion_local;
  SysLogger *pSStack_10;
  LogLevel aLevel_local;
  SysLogger *this_local;
  
  if (aLevel <= this->mLogLevel) {
    local_28 = aMsg;
    aMsg_local = aRegion;
    aRegion_local._7_1_ = aLevel;
    pSStack_10 = this;
    __pri = ToSysLogLevel(aLevel);
    __return_storage_ptr__ = &local_48;
    ToString_abi_cxx11_(__return_storage_ptr__,(commissioner *)(ulong)aRegion_local._7_1_,aLevel_00)
    ;
    uVar1 = std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    syslog(__pri,"%s [ %s ] %s",uVar1,uVar2,uVar3,in_R9,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void SysLogger::Log(LogLevel aLevel, const std::string &aRegion, const std::string &aMsg)
{
    if (aLevel <= mLogLevel)
    {
        syslog(ToSysLogLevel(aLevel), "%s [ %s ] %s", ToString(aLevel).c_str(), aRegion.c_str(), aMsg.c_str());
    }
}